

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_log.cxx
# Opt level: O2

void xray_re::die(char *message,char *file,uint line)

{
  char *pcVar1;
  xr_log *this;
  long lVar2;
  
  this = xr_log::instance();
  xr_log::fatal(this,message,file,line);
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    pcVar1 = this[0x23].m_buf + lVar2 * 4 + 0x104;
    pcVar1[0] = '\0';
    pcVar1[1] = '\x10';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  for (lVar2 = 0; lVar2 != 0x1000; lVar2 = lVar2 + 1) {
    pcVar1 = this[0x24].m_buf + lVar2 * 4 + 0xec;
    pcVar1[0] = '\0';
    pcVar1[1] = '\x10';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  return;
}

Assistant:

void xray_re::die(const char* message, const char* file, unsigned line)
{
	xr_log::instance().fatal(message, file, line);
}